

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O0

bool anon_unknown.dwarf_17041f::write_stream(ostream *os,WriteOptions *options,Node *stream)

{
  bool bVar1;
  Node *pNVar2;
  element_type *this;
  reference psVar3;
  shared_ptr<trieste::NodeDef> local_a0;
  undefined1 local_90 [8];
  shared_ptr<trieste::NodeDef> document;
  iterator __end1;
  iterator __begin1;
  element_type *__range1;
  bool not_first;
  Token local_58;
  WFLookup local_50;
  undefined1 local_30 [8];
  Node documents;
  Node *stream_local;
  WriteOptions *options_local;
  ostream *os_local;
  
  documents.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stream;
  trieste::Token::Token(&local_58,(TokenDef *)trieste::yaml::Documents);
  trieste::operator/(&local_50,stream,&local_58);
  pNVar2 = trieste::wf::detail::WFLookup::operator_cast_to_shared_ptr_(&local_50);
  CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr
            ((shared_ptr<trieste::NodeDef> *)local_30,pNVar2);
  trieste::wf::detail::WFLookup::~WFLookup(&local_50);
  __range1._3_1_ = false;
  this = CLI::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_30);
  __end1._M_current = (shared_ptr<trieste::NodeDef> *)trieste::NodeDef::begin(this);
  document.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trieste::NodeDef::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                      (&__end1,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                *)&document.
                                   super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
             ::operator*(&__end1);
    CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr
              ((shared_ptr<trieste::NodeDef> *)local_90,psVar3);
    CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr
              (&local_a0,(shared_ptr<trieste::NodeDef> *)local_90);
    write_document(os,options,&local_a0,__range1._3_1_);
    CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_a0);
    __range1._3_1_ = true;
    CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_90);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
    ::operator++(&__end1);
  }
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_30);
  return false;
}

Assistant:

bool write_stream(std::ostream& os, WriteOptions& options, Node stream)
  {
    Node documents = stream / Documents;
    bool not_first = false;
    for (auto document : *documents)
    {
      write_document(os, options, document, not_first);
      not_first = true;
    }
    return false;
  }